

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResult.cpp
# Opt level: O3

void __thiscall
PipelineResult::PipelineResult
          (PipelineResult *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,bool dead,
          float netRotation,Vec2d *netOffset)

{
  Quad *quadToCopy;
  vector<Quad*,std::allocator<Quad*>> *this_00;
  iterator __position;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar1;
  Quad *this_01;
  Vec2d *this_02;
  undefined7 in_register_00000011;
  pointer ppQVar2;
  Quad *local_50;
  pointer local_48;
  Vec2d *local_40;
  float local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,dead);
  local_40 = netOffset;
  local_38 = netRotation;
  pvVar1 = (vector<Quad_*,_std::allocator<Quad_*>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->quads = pvVar1;
  ppQVar2 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppQVar2 != local_48) {
    do {
      quadToCopy = *ppQVar2;
      this_00 = (vector<Quad*,std::allocator<Quad*>> *)this->quads;
      this_01 = (Quad *)operator_new(0x20);
      Quad::Quad(this_01,quadToCopy);
      __position._M_current = *(Quad ***)(this_00 + 8);
      local_50 = this_01;
      if (__position._M_current == *(Quad ***)(this_00 + 0x10)) {
        std::vector<Quad*,std::allocator<Quad*>>::_M_realloc_insert<Quad*>
                  (this_00,__position,&local_50);
      }
      else {
        *__position._M_current = this_01;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      ppQVar2 = ppQVar2 + 1;
    } while (ppQVar2 != local_48);
  }
  this->dead = SUB41(local_34,0);
  this->netRotation = local_38;
  this_02 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_02,local_40);
  this->netOffset = this_02;
  return;
}

Assistant:

PipelineResult::PipelineResult(vector<Quad*>* quads, bool dead, float netRotation, Vec2d* netOffset) {
    this->quads = new vector<Quad*>();
    for (auto quad : *quads) {
        this->quads->push_back(new Quad(quad));
    }
    this->dead = dead;
    this->netRotation = netRotation;
    this->netOffset = new Vec2d(netOffset);
}